

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh_fixture.c
# Opt level: O0

int run_command_varg(char **output,char *command,__va_list_tag *args)

{
  size_t sVar1;
  FILE *__stream;
  char *pcVar2;
  ushort **ppuVar3;
  bool bVar4;
  size_t end;
  size_t buf_len;
  char local_4048 [4];
  int ret;
  char buf [8200];
  char local_2038 [8];
  char command_buf [8192];
  FILE *pipe;
  __va_list_tag *args_local;
  char *command_local;
  char **output_local;
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  buf_len._4_4_ = vsnprintf(local_2038,0x2000,command,args);
  if (((int)buf_len._4_4_ < 0) || (0x1fff < (int)buf_len._4_4_)) {
    fprintf(_stderr,"Unable to format command (%s)\n",command);
    output_local._4_4_ = 0xffffffff;
  }
  else {
    sVar1 = strlen(local_2038);
    if (sVar1 + 7 < 0x2008) {
      buf_len._4_4_ = snprintf(local_4048,0x2008,"%s 2>&1",local_2038);
      if (((int)buf_len._4_4_ < 0) || (0x1fff < (int)buf_len._4_4_)) {
        fprintf(_stderr,"Unable to rewrite command (%s)\n",command);
        output_local._4_4_ = 0xffffffff;
      }
      else {
        fprintf(_stdout,"Command: %s\n",local_2038);
        __stream = popen(local_4048,"r");
        if (__stream == (FILE *)0x0) {
          fprintf(_stderr,"Unable to execute command \'%s\'\n",command);
          output_local._4_4_ = 0xffffffff;
        }
        else {
          local_4048[0] = '\0';
          end = 0;
          while( true ) {
            bVar4 = false;
            if (end < 0x2007) {
              pcVar2 = fgets(local_4048 + end,0x2008 - (int)end,__stream);
              bVar4 = pcVar2 != (char *)0x0;
            }
            if (!bVar4) break;
            end = strlen(local_4048);
          }
          buf_len._4_4_ = pclose(__stream);
          if (buf_len._4_4_ != 0) {
            fprintf(_stderr,"Error running command \'%s\' (exit %d): %s\n",command,
                    (ulong)buf_len._4_4_,local_4048);
          }
          if (output != (char **)0x0) {
            sVar1 = strlen(local_4048);
            while( true ) {
              bVar4 = false;
              if (sVar1 != 0) {
                ppuVar3 = __ctype_b_loc();
                bVar4 = ((*ppuVar3)[(int)local_4048[sVar1 - 1]] & 0x2000) != 0;
              }
              if (!bVar4) break;
              local_4048[sVar1 - 1] = '\0';
            }
            pcVar2 = strdup(local_4048);
            *output = pcVar2;
          }
          output_local._4_4_ = buf_len._4_4_;
        }
      }
    }
    else {
      fprintf(_stderr,"Unable to rewrite command (%s)\n",command);
      output_local._4_4_ = 0xffffffff;
    }
  }
  return output_local._4_4_;
}

Assistant:

static int run_command_varg(char **output, const char *command, va_list args)
{
    static const char redirect_stderr[] = "%s 2>&1";

    FILE *pipe;
    char command_buf[BUFSIZ];
    char buf[BUFSIZ + sizeof(redirect_stderr)];
    int ret;
    size_t buf_len;

    if(output) {
        *output = NULL;
    }

    /* Format the command string */
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
    ret = vsnprintf(command_buf, sizeof(command_buf), command, args);
#ifdef __clang__
#pragma clang diagnostic pop
#endif
    if(ret < 0 || ret >= BUFSIZ) {
        fprintf(stderr, "Unable to format command (%s)\n", command);
        return -1;
    }

    /* Rewrite the command to redirect stderr to stdout to we can output it */
    if(strlen(command_buf) + strlen(redirect_stderr) >= sizeof(buf)) {
        fprintf(stderr, "Unable to rewrite command (%s)\n", command);
        return -1;
    }

    ret = snprintf(buf, sizeof(buf), redirect_stderr, command_buf);
    if(ret < 0 || ret >= BUFSIZ) {
        fprintf(stderr, "Unable to rewrite command (%s)\n", command);
        return -1;
    }

    fprintf(stdout, "Command: %s\n", command_buf);
    pipe = popen(buf, "r");
    if(!pipe) {
        fprintf(stderr, "Unable to execute command '%s'\n", command);
        return -1;
    }
    buf[0] = 0;
    buf_len = 0;
    while(buf_len < (sizeof(buf) - 1) &&
        fgets(&buf[buf_len], (int)(sizeof(buf) - buf_len), pipe)) {
        buf_len = strlen(buf);
    }

    ret = pclose(pipe);
    if(ret) {
        fprintf(stderr, "Error running command '%s' (exit %d): %s\n",
                command, ret, buf);
    }

    if(output) {
        /* command output may contain a trailing newline, so we trim
         * whitespace here */
        size_t end = strlen(buf);
        while(end > 0 && isspace((int)buf[end - 1])) {
            buf[end - 1] = '\0';
        }

        *output = strdup(buf);
    }
    return ret;
}